

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::Free(Instr *this)

{
  code *pcVar1;
  IRKind IVar2;
  bool bVar3;
  LabelInstr *pLVar4;
  BranchInstr *this_00;
  Opnd *pOVar5;
  StackSym *this_01;
  undefined4 *puVar6;
  Func *pFVar7;
  bool local_39;
  StackSym *stackSym;
  Opnd *dstOpnd;
  BranchInstr *branchInstr;
  Instr *this_local;
  
  IVar2 = GetKind(this);
  local_39 = true;
  if (IVar2 != InstrKindLabel) {
    local_39 = IsProfiledLabelInstr(this);
  }
  if ((local_39 != false) && (pLVar4 = AsLabelInstr(this), ((byte)pLVar4->field_0x78 >> 2 & 1) != 0)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x14b,"(!this->IsLabelInstr() || !this->AsLabelInstr()->m_hasNonBranchRef)",
                       "Cannot free label with non-branch reference");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  IVar2 = GetKind(this);
  if (IVar2 == InstrKindBranch) {
    this_00 = AsBranchInstr(this);
    BranchInstr::ClearTarget(this_00);
  }
  pOVar5 = GetDst(this);
  if (pOVar5 != (Opnd *)0x0) {
    this_01 = Opnd::GetStackSym(pOVar5);
    if (this_01 != (StackSym *)0x0) {
      if ((*(uint *)&this_01->field_0x18 & 1) == 0) {
        if ((((*(uint *)&this_01->field_0x18 >> 3 & 1) != 0) ||
            ((this_01->field_5).m_instrDef != (Instr *)0x0)) &&
           (((*(uint *)&this_01->field_0x18 >> 6 & 1) == 0 ||
            ((this_01->field_5).m_instrDef == (Instr *)0x0)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0x174,
                             "((!stackSym->m_isConst && stackSym->constantValue == 0) || (stackSym->m_isEncodedConstant && stackSym->constantValue != 0))"
                             ,
                             "(!stackSym->m_isConst && stackSym->constantValue == 0) || (stackSym->m_isEncodedConstant && stackSym->constantValue != 0)"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
      else {
        if ((*(uint *)&this_01->field_0x18 >> 6 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0x15f,"(!stackSym->m_isEncodedConstant)",
                             "!stackSym->m_isEncodedConstant");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if ((this_01->field_5).m_instrDef == this) {
          if ((char)pOVar5->field_0xb < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                               ,0x162,"(!dstOpnd->isFakeDst)","!dstOpnd->isFakeDst");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          bVar3 = StackSym::IsConst(this_01);
          if (bVar3) {
            return;
          }
          pFVar7 = Func::GetTopFunc(this->m_func);
          if (((pFVar7->allowRemoveBailOutArgInstr & 1U) == 0) &&
             ((*(uint *)&this_01->field_0x18 >> 0x18 & 1) != 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                               ,0x169,
                               "(this->m_func->GetTopFunc()->allowRemoveBailOutArgInstr || !stackSym->m_isBailOutReferenced)"
                               ,
                               "this->m_func->GetTopFunc()->allowRemoveBailOutArgInstr || !stackSym->m_isBailOutReferenced"
                              );
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
        else if (-1 < (char)pOVar5->field_0xb) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0x16d,"(dstOpnd->isFakeDst)","dstOpnd->isFakeDst");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    FreeDst(this);
  }
  pOVar5 = GetSrc1(this);
  if (pOVar5 != (Opnd *)0x0) {
    FreeSrc1(this);
  }
  pOVar5 = GetSrc2(this);
  if (pOVar5 != (Opnd *)0x0) {
    FreeSrc2(this);
  }
  ClearBailOutInfo(this);
  Memory::DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,IR::Instr>
            (this->m_func->m_alloc,this);
  return;
}

Assistant:

void
Instr::Free()
{
    AssertMsg(!this->IsLabelInstr() || !this->AsLabelInstr()->m_hasNonBranchRef,
        "Cannot free label with non-branch reference");

    switch (this->GetKind())
    {
    case InstrKindBranch:
        {
            IR::BranchInstr *branchInstr = this->AsBranchInstr();
            branchInstr->ClearTarget();
            break;
        }
    }

    IR::Opnd * dstOpnd = this->GetDst();
    if (dstOpnd)
    {
        StackSym * stackSym = dstOpnd->GetStackSym();
        if (stackSym)
        {
            if (stackSym->m_isSingleDef)
            {
                Assert(!stackSym->m_isEncodedConstant);
                if (stackSym->m_instrDef == this)
                {
                    Assert(!dstOpnd->isFakeDst);
                    if (stackSym->IsConst())
                    {
                        // keep the instruction around so we can get the constant value
                        // from the symbol
                        return;
                    }
                    Assert(this->m_func->GetTopFunc()->allowRemoveBailOutArgInstr || !stackSym->m_isBailOutReferenced);
                }
                else
                {
                    Assert(dstOpnd->isFakeDst);
                }
            }
            else
            {
                // Encoded constants are not single-defs anymore, and therefore not isConst.
                Assert((!stackSym->m_isConst && stackSym->constantValue == 0)
                    || (stackSym->m_isEncodedConstant && stackSym->constantValue != 0));
            }
        }
        this->FreeDst();
    }
    if (this->GetSrc1())
    {
        this->FreeSrc1();
    }
    if (this->GetSrc2())
    {
        // This pattern isn't so unusual:
        //     src = instr->UnlinkSrc1();
        //     instr->Remove();
        this->FreeSrc2();
    }

    ClearBailOutInfo();
    JitAdelete(this->m_func->m_alloc, this);
}